

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elempatch.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 in_RSI;
  int ok;
  int op;
  int d;
  int stack;
  int heap;
  int nproc;
  int me;
  int in_stack_000002dc;
  int in_stack_000002e0;
  int in_stack_000002e4;
  size_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  GA::Initialize((int)((ulong)in_RSI >> 0x20),
                 (char **)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                 0x30d4000030d40,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),1,
                 in_stack_ffffffffffffffc8);
  iVar1 = GA_Nodeid();
  iVar2 = GA_Nnodes();
  poVar3 = std::operator<<((ostream *)&std::cout,"Rank = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," : Size = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
  std::operator<<(poVar3,"\n");
  std::operator<<((ostream *)&std::cout,"After Initialize()\n");
  for (iVar2 = 0; iVar2 < 7; iVar2 = iVar2 + 1) {
    for (uVar4 = 1; (int)uVar4 < 4; uVar4 = uVar4 + 1) {
      if (iVar1 == 0) {
        printf("\n\ndim =%d\n\n",(ulong)uVar4);
      }
      if (iVar1 == 0) {
        printf("data type: int\t\t");
      }
      test_fun(in_stack_000002e4,in_stack_000002e0,in_stack_000002dc);
      if (iVar1 == 0) {
        printf("data type: double\t");
      }
      test_fun(in_stack_000002e4,in_stack_000002e0,in_stack_000002dc);
      if (iVar1 == 0) {
        printf("data type: float\t");
      }
      test_fun(in_stack_000002e4,in_stack_000002e0,in_stack_000002dc);
      if (iVar1 == 0) {
        printf("data type: long\t\t");
      }
      test_fun(in_stack_000002e4,in_stack_000002e0,in_stack_000002dc);
      if (iVar1 == 0) {
        printf("data type: complex\t");
      }
      test_fun(in_stack_000002e4,in_stack_000002e0,in_stack_000002dc);
    }
  }
  if (iVar1 == 0) {
    std::operator<<((ostream *)&std::cout,"Terminating\n");
  }
  GA::Terminate();
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
 
  int me, nproc;
  int heap  = 200000, stack = 200000;
  int d, op, ok = 1;

  GA::Initialize(argc, argv, heap, stack, GA_DATA_TYPE, 0);
  me=GA_Nodeid(); nproc=GA_Nnodes();
  cout << "Rank = " << me << " : Size = " << nproc << "\n";

  cout << "After Initialize()\n";
  
  for (op = 0; op < 7; op++) {
    for (d = 1; d < 4; d++) {
      if (me == 0)  printf ("\n\ndim =%d\n\n", d);
  
      if (me == 0)  printf ("data type: int\t\t");
      ok = test_fun (C_INT, d, op);
      
      if (me == 0)  printf ("data type: double\t");
      ok = test_fun (C_DBL, d, op);
      
      if (me == 0)  printf ("data type: float\t");
      ok = test_fun (C_FLOAT, d, op);
      
      if (me == 0)  printf ("data type: long\t\t");
      ok = test_fun (C_LONG, d, op);
      
      if (me == 0)  printf ("data type: complex\t");
      test_fun (C_DCPL, d, op);
    }
  }
  
  if(!me) cout << "Terminating\n";
  GA::Terminate();
}